

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall
QDateTimeEdit::setCalendarWidget(QDateTimeEdit *this,QCalendarWidget *calendarWidget)

{
  QDateTimeEditPrivate *this_00;
  char *pcVar1;
  long in_FS_OFFSET;
  char local_28 [24];
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (calendarWidget == (QCalendarWidget *)0x0) {
    pcVar1 = "QDateTimeEdit::setCalendarWidget: Cannot set a null calendar widget";
  }
  else {
    this_00 = *(QDateTimeEditPrivate **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
    if (this_00->calendarPopup == false) {
      pcVar1 = "QDateTimeEdit::setCalendarWidget: calendarPopup is set to false";
    }
    else {
      if ((this_00->field_0x3e9 & 0x3f) != 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
          QDateTimeEditPrivate::initCalendarPopup(this_00,calendarWidget);
          return;
        }
        goto LAB_003bfa36;
      }
      pcVar1 = "QDateTimeEdit::setCalendarWidget: no date sections specified";
    }
  }
  local_10 = "default";
  local_28[0x14] = '\0';
  local_28[0x15] = '\0';
  local_28[0x16] = '\0';
  local_28[0x17] = '\0';
  local_28[0xc] = '\0';
  local_28[0xd] = '\0';
  local_28[0xe] = '\0';
  local_28[0xf] = '\0';
  local_28[0x10] = '\0';
  local_28[0x11] = '\0';
  local_28[0x12] = '\0';
  local_28[0x13] = '\0';
  local_28[4] = '\0';
  local_28[5] = '\0';
  local_28[6] = '\0';
  local_28[7] = '\0';
  local_28[8] = '\0';
  local_28[9] = '\0';
  local_28[10] = '\0';
  local_28[0xb] = '\0';
  local_28[0] = '\x02';
  local_28[1] = '\0';
  local_28[2] = '\0';
  local_28[3] = '\0';
  QMessageLogger::warning(local_28,pcVar1);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_003bfa36:
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setCalendarWidget(QCalendarWidget *calendarWidget)
{
    Q_D(QDateTimeEdit);
    if (Q_UNLIKELY(!calendarWidget)) {
        qWarning("QDateTimeEdit::setCalendarWidget: Cannot set a null calendar widget");
        return;
    }

    if (Q_UNLIKELY(!d->calendarPopup)) {
        qWarning("QDateTimeEdit::setCalendarWidget: calendarPopup is set to false");
        return;
    }

    if (Q_UNLIKELY(!(d->display & QDateTimeParser::DateSectionMask))) {
        qWarning("QDateTimeEdit::setCalendarWidget: no date sections specified");
        return;
    }
    d->initCalendarPopup(calendarWidget);
}